

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::ImageSupport::ImageSupport
          (ImageSupport *this,ResourceDescription *resourceDesc,AccessMode mode,
          VkShaderStageFlagBits stage,DispatchCall dispatchCall)

{
  char *__s;
  allocator<char> local_21;
  
  (this->super_OperationSupport)._vptr_OperationSupport = (_func_int **)&PTR__ImageSupport_00c0aa18;
  ResourceDescription::ResourceDescription(&this->m_resourceDesc,resourceDesc);
  this->m_mode = mode;
  this->m_stage = stage;
  __s = "write_image_";
  if (mode == ACCESS_MODE_READ) {
    __s = "read_image_";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_shaderPrefix,__s,&local_21);
  this->m_dispatchCall = dispatchCall;
  return;
}

Assistant:

ImageSupport (const ResourceDescription&	resourceDesc,
				  const AccessMode				mode,
				  const VkShaderStageFlagBits	stage,
				  const DispatchCall			dispatchCall = DISPATCH_CALL_DISPATCH)
		: m_resourceDesc	(resourceDesc)
		, m_mode			(mode)
		, m_stage			(stage)
		, m_shaderPrefix	(m_mode == ACCESS_MODE_READ ? "read_image_" : "write_image_")
		, m_dispatchCall	(dispatchCall)
	{
		DE_ASSERT(m_resourceDesc.type == RESOURCE_TYPE_IMAGE);
		DE_ASSERT(m_mode == ACCESS_MODE_READ || m_mode == ACCESS_MODE_WRITE);
		DE_ASSERT(m_dispatchCall == DISPATCH_CALL_DISPATCH || m_dispatchCall == DISPATCH_CALL_DISPATCH_INDIRECT);

		assertValidShaderStage(m_stage);
	}